

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O0

b_edge * __thiscall
xray_re::xr_mesh_builder::find_edge(xr_mesh_builder *this,uint_fast32_t v0,uint_fast32_t v1)

{
  uint uVar1;
  reference pvVar2;
  reference pvVar3;
  b_edge *edge_1;
  uint_fast32_t next_1;
  b_edge *edge;
  uint_fast32_t next;
  uint_fast32_t v1_local;
  uint_fast32_t v0_local;
  xr_mesh_builder *this_local;
  
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->m_vertex_edges,v0);
  uVar1 = *pvVar2;
  while (edge = (b_edge *)(ulong)uVar1, edge != (b_edge *)0xffffffff) {
    pvVar3 = std::
             vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
             ::operator[](&this->m_edges,(size_type)edge);
    if (pvVar3->v1 == v1) {
      return pvVar3;
    }
    uVar1 = pvVar3->link;
  }
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->m_vertex_edges,v1);
  uVar1 = *pvVar2;
  while( true ) {
    edge_1 = (b_edge *)(ulong)uVar1;
    if (edge_1 == (b_edge *)0xffffffff) {
      return (b_edge *)0x0;
    }
    pvVar3 = std::
             vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
             ::operator[](&this->m_edges,(size_type)edge_1);
    if (pvVar3->v1 == v0) break;
    uVar1 = pvVar3->link;
  }
  return pvVar3;
}

Assistant:

xr_mesh_builder::b_edge* xr_mesh_builder::find_edge(uint_fast32_t v0, uint_fast32_t v1)
{
	for (uint_fast32_t next = m_vertex_edges[v0]; next != BAD_IDX;) {
		b_edge* edge = &m_edges[next];
		if (edge->v1 == v1)
			return edge;
		next = edge->link;
	}
	for (uint_fast32_t next = m_vertex_edges[v1]; next != BAD_IDX;) {
		b_edge* edge = &m_edges[next];
		if (edge->v1 == v0)
			return edge;
		next = edge->link;
	}
	return 0;
}